

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFileParser.cpp
# Opt level: O2

void __thiscall LabelFileParser::writeLabelList(LabelFileParser *this,string *labelListFilename)

{
  pointer pbVar1;
  int c;
  ulong uVar2;
  long lVar3;
  ofstream labelListFp;
  
  std::ofstream::ofstream((string *)&labelListFp);
  std::ofstream::open((string *)&labelListFp,(_Ios_Openmode)labelListFilename);
  lVar3 = 0;
  for (uVar2 = 0;
      pbVar1 = (this->_labelList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->_labelList).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar2 = uVar2 + 1) {
    std::operator<<((ostream *)&labelListFp,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
    if (uVar2 != ((long)(this->_labelList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->_labelList).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      std::endl<char,std::char_traits<char>>((ostream *)&labelListFp);
    }
    lVar3 = lVar3 + 0x20;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&labelListFp);
  return;
}

Assistant:

void LabelFileParser::writeLabelList(string labelListFilename)const{//{{{
    ofstream labelListFp;
    labelListFp.open(labelListFilename,ios::out);
    for(int c=0; c<_labelList.size(); c++){
        labelListFp<<_labelList[c];
        if(c != (_labelList.size()-1))labelListFp<<endl;
    }
    labelListFp.close();
}